

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O3

void __thiscall
QTextDocumentPrivate::scan_frames
          (QTextDocumentPrivate *this,int pos,int charsRemoved,int charsAdded)

{
  char16_t cVar1;
  uint uVar2;
  Header *pHVar3;
  long lVar4;
  uint n;
  QTextFrame *f;
  QTextFrame *pQVar5;
  QPodArrayOps<QTextFrame*> *pQVar6;
  long in_FS_OFFSET;
  QTextFrame *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  f = rootFrame(this);
  clearFrame(f);
  pHVar3 = (this->fragments).data.field_0.head;
  uVar2 = pHVar3->root;
  do {
    n = uVar2;
    if (n == 0) goto LAB_004d3d1e;
    uVar2 = *(uint *)((long)pHVar3 + (ulong)n * 0x20 + 4);
  } while (uVar2 != 0);
  do {
    objectForFormat(this,(this->fragments).data.field_0.fragments[n].format);
    pQVar5 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextFrame::staticMetaObject);
    if (pQVar5 != (QTextFrame *)0x0) {
      cVar1 = (this->text).d.ptr[(this->fragments).data.field_0.fragments[n].stringPosition];
      if (cVar1 == L'￼') {
        *(QTextFrame **)(*(long *)&(pQVar5->super_QTextObject).field_0x8 + 0x90) = f;
        lVar4 = *(long *)&(f->super_QTextObject).field_0x8;
        pQVar6 = (QPodArrayOps<QTextFrame*> *)(lVar4 + 0x98);
        local_40 = pQVar5;
        QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                  (pQVar6,*(qsizetype *)(lVar4 + 0xa8),&local_40);
        QList<QTextFrame_*>::end((QList<QTextFrame_*> *)pQVar6);
      }
      else if (cVar1 == L'﷑') {
        f = *(QTextFrame **)(*(long *)&(pQVar5->super_QTextObject).field_0x8 + 0x90);
      }
      else if ((cVar1 == L'﷐') && (f != pQVar5)) {
        *(QTextFrame **)(*(long *)&(pQVar5->super_QTextObject).field_0x8 + 0x90) = f;
        lVar4 = *(long *)&(f->super_QTextObject).field_0x8;
        pQVar6 = (QPodArrayOps<QTextFrame*> *)(lVar4 + 0x98);
        local_40 = pQVar5;
        QtPrivate::QPodArrayOps<QTextFrame*>::emplace<QTextFrame*&>
                  (pQVar6,*(qsizetype *)(lVar4 + 0xa8),&local_40);
        QList<QTextFrame_*>::end((QList<QTextFrame_*> *)pQVar6);
        f = pQVar5;
      }
    }
    n = QFragmentMapData<QTextFragmentData>::next(&(this->fragments).data,n);
  } while (n != 0);
LAB_004d3d1e:
  this->framesDirty = false;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::scan_frames(int pos, int charsRemoved, int charsAdded)
{
    // ###### optimize
    Q_UNUSED(pos);
    Q_UNUSED(charsRemoved);
    Q_UNUSED(charsAdded);

    QTextFrame *f = rootFrame();
    clearFrame(f);

    for (FragmentIterator it = begin(); it != end(); ++it) {
        // QTextFormat fmt = formats.format(it->format);
        QTextFrame *frame = qobject_cast<QTextFrame *>(objectForFormat(it->format));
        if (!frame)
            continue;

        Q_ASSERT(it.size() == 1);
        QChar ch = text.at(it->stringPosition);

        if (ch == QTextBeginningOfFrame) {
            if (f != frame) {
                // f == frame happens for tables
                Q_ASSERT(frame->d_func()->fragment_start == it.n || frame->d_func()->fragment_start == 0);
                frame->d_func()->parentFrame = f;
                f->d_func()->childFrames.append(frame);
                f = frame;
            }
        } else if (ch == QTextEndOfFrame) {
            Q_ASSERT(f == frame);
            Q_ASSERT(frame->d_func()->fragment_end == it.n || frame->d_func()->fragment_end == 0);
            f = frame->d_func()->parentFrame;
        } else if (ch == QChar::ObjectReplacementCharacter) {
            Q_ASSERT(f != frame);
            Q_ASSERT(frame->d_func()->fragment_start == it.n || frame->d_func()->fragment_start == 0);
            Q_ASSERT(frame->d_func()->fragment_end == it.n || frame->d_func()->fragment_end == 0);
            frame->d_func()->parentFrame = f;
            f->d_func()->childFrames.append(frame);
        } else {
            Q_ASSERT(false);
        }
    }
    Q_ASSERT(f == rtFrame);
    framesDirty = false;
}